

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentence_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::SentenceTests_ManyTokens_Test::TestBody(SentenceTests_ManyTokens_Test *this)

{
  string_view line_00;
  bool bVar1;
  char *pcVar2;
  reference pvVar3;
  AssertHelper local_f0;
  Message local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_3;
  Message local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_2;
  Message local_a8;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_88;
  Message local_80 [3];
  size_type local_68;
  int local_5c;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  undefined1 local_38 [8];
  Sentence s;
  string_view line;
  SentenceTests_ManyTokens_Test *this_local;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             &s.
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,"  foo bar  baz    ");
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       s.
       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  line_00._M_str = (char *)line._M_len;
  line_00._M_len =
       (size_t)s.
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  tokens<false>((Sentence *)local_38,line_00);
  local_5c = 3;
  local_68 = std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::size((Sentence *)local_38);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_58,"3","s.size()",&local_5c,&local_68);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    testing::Message::Message(local_80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/sentence_test.cpp"
               ,0x1c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message(local_80);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    pvVar3 = std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)local_38,0);
    testing::internal::EqHelper<false>::
    Compare<char[4],std::basic_string_view<char,std::char_traits<char>>>
              ((EqHelper<false> *)local_a0,"\"foo\"","s[0]",(char (*) [4])"foo",pvVar3);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
    if (!bVar1) {
      testing::Message::Message(&local_a8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/sentence_test.cpp"
                 ,0x1d,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_a8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_a8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
    pvVar3 = std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)local_38,1);
    testing::internal::EqHelper<false>::
    Compare<char[4],std::basic_string_view<char,std::char_traits<char>>>
              ((EqHelper<false> *)local_c0,"\"bar\"","s[1]",(char (*) [4])"bar",pvVar3);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
    if (!bVar1) {
      testing::Message::Message(&local_c8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/sentence_test.cpp"
                 ,0x1e,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
    pvVar3 = std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)local_38,2);
    testing::internal::EqHelper<false>::
    Compare<char[4],std::basic_string_view<char,std::char_traits<char>>>
              ((EqHelper<false> *)local_e0,"\"baz\"","s[2]",(char (*) [4])0x186b3c,pvVar3);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
    if (!bVar1) {
      testing::Message::Message(&local_e8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
      testing::internal::AssertHelper::AssertHelper
                (&local_f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/sentence_test.cpp"
                 ,0x1f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_f0);
      testing::Message::~Message(&local_e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
    gtest_ar_1.message_.ptr_._4_4_ = 0;
  }
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)local_38);
  return;
}

Assistant:

TEST(SentenceTests, ManyTokens) {
  std::string_view line = "  foo bar  baz    ";
  auto s = tokens<false>(line);
  ASSERT_EQ(3, s.size());
  EXPECT_EQ("foo", s[0]);
  EXPECT_EQ("bar", s[1]);
  EXPECT_EQ("baz", s[2]);
}